

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall
FxCompareEq::EmitCommon(FxCompareEq *this,VMFunctionBuilder *build,bool forcompare,bool invert)

{
  int iVar1;
  FxExpression *pFVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint extraout_var;
  uint extraout_var_00;
  ExpEmit EVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  ulong local_50;
  
  uVar4 = (*((this->super_FxBinary).left)->_vptr_FxExpression[9])();
  pFVar2 = (this->super_FxBinary).right;
  uVar5 = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
  bVar9 = (byte)(uVar4 >> 0x10);
  if (bVar9 != (byte)(uVar5 >> 0x10)) {
    __assert_fail("op1.RegType == op2.RegType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xdcd,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
  }
  uVar3 = extraout_var >> 8;
  bVar12 = (byte)(uVar5 >> 0x18);
  uVar8 = extraout_var_00 >> 8;
  if (bVar9 == 2) {
    uVar6 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    iVar1 = (this->super_FxBinary).Operator;
    if (2 < iVar1 - 0x11fU) {
      __assert_fail("Operator == TK_Eq || Operator == TK_Neq || Operator == TK_ApproxEq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdd3,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    uVar8 = 0x20;
    if (iVar1 == 0x120) {
      uVar8 = 1;
    }
    uVar10 = 0;
    if (iVar1 != 0x11f) {
      uVar10 = uVar8;
    }
    uVar8 = uVar10 + 8;
    if ((extraout_var & 1) == 0) {
      uVar8 = uVar10;
    }
    uVar10 = uVar8 + 0x10;
    if ((extraout_var_00 & 1) == 0) {
      uVar10 = uVar8;
    }
    uVar10 = invert ^ uVar10;
    if (forcompare) {
      VMFunctionBuilder::Emit(build,0x59,uVar10,uVar4 & 0xffff,uVar5 & 0xffff);
    }
    else {
      VMFunctionBuilder::Emit(build,1,uVar6 & 0xffff,0,0);
      VMFunctionBuilder::Emit(build,0x59,uVar10,uVar4 & 0xffff,uVar5 & 0xffff);
      VMFunctionBuilder::Emit(build,0x44,1);
      VMFunctionBuilder::Emit(build,1,uVar6 & 0xffff,1);
    }
    if (((uVar3 | extraout_var) & 1) == 0) {
      VMFunctionBuilder::RegAvailability::Return(build->Registers + 2,uVar4 & 0xffff,uVar4 >> 0x18);
    }
    if (((extraout_var_00 >> 8 | extraout_var_00) & 1) == 0) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var_00,uVar5) >> 0x10) & 3),
                 uVar5 & 0xffff,uVar5 >> 0x18);
    }
  }
  else {
    local_50 = CONCAT44(extraout_var,uVar4);
    uVar10 = extraout_var_00;
    uVar6 = extraout_var;
    uVar13 = uVar3;
    uVar11 = uVar4;
    if ((extraout_var & 1) != 0) {
      local_50 = CONCAT44(extraout_var_00,uVar5);
      uVar10 = extraout_var;
      uVar6 = extraout_var_00;
      uVar13 = uVar8;
      uVar8 = uVar3;
      uVar11 = uVar5;
      uVar5 = uVar4;
      bVar12 = (byte)(uVar4 >> 0x18);
    }
    local_50._0_4_ = uVar11;
    uVar3 = (uint)local_50;
    if ((uVar6 & 1) != 0) {
      __assert_fail("!op1.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdee,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    if (2 < (byte)((char)(local_50 >> 0x18) - 1U)) {
      __assert_fail("op1.RegCount >= 1 && op1.RegCount <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdef,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    uVar6 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    if (bVar9 == 0) {
      uVar11 = 0x89;
    }
    else if ((uVar4 >> 0x10 & 0xff) == 1) {
      uVar11 = (&UINT_00620988)[local_50 >> 0x18 & 0xff];
    }
    else {
      uVar11 = 0xcf;
    }
    uVar4 = (uint)(CONCAT44(extraout_var,uVar4) >> 0x10);
    if (((uVar13 & 1) == 0) && (bVar9 < 4)) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + (uVar4 & 3),uVar3 & 0xffff,(uint)(local_50 >> 0x18) & 0xff);
    }
    if ((uVar10 & 1) == 0) {
      if ((uVar8 & 1) == 0 && bVar9 < 4) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + (uVar4 & 3),uVar5 & 0xffff,(uint)bVar12);
      }
    }
    else {
      uVar11 = uVar11 + 1;
    }
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,1,uVar6 & 0xffff,0,0);
    }
    iVar1 = (this->super_FxBinary).Operator;
    uVar4 = 0x20;
    if (iVar1 != 0x121) {
      uVar4 = (uint)(iVar1 != 0x11f);
    }
    VMFunctionBuilder::Emit(build,uVar11,uVar4 ^ invert,uVar3 & 0xffff,uVar5 & 0xffff);
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,0x44,1);
      VMFunctionBuilder::Emit(build,1,uVar6 & 0xffff,1);
    }
  }
  EVar7._0_4_ = uVar6 & 0xffff | 0x1000000;
  EVar7.Konst = false;
  EVar7.Fixed = false;
  EVar7.Final = false;
  EVar7.Target = false;
  return EVar7;
}

Assistant:

ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *build, bool forcompare, bool invert)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	assert(op1.RegType == op2.RegType);
	int instr;

	if (op1.RegType == REGT_STRING)
	{
		ExpEmit to(build, REGT_INT);
		assert(Operator == TK_Eq || Operator == TK_Neq || Operator == TK_ApproxEq);
		int a = Operator == TK_Eq ? CMP_EQ :
			Operator == TK_Neq ? CMP_EQ | CMP_CHECK : CMP_EQ | CMP_APPROX;

		if (op1.Konst) a |= CMP_BK;
		if (op2.Konst) a |= CMP_CK;
		if (invert) a ^= CMP_CHECK;

		if (!forcompare) build->Emit(OP_LI, to.RegNum, 0, 0);
		build->Emit(OP_CMPS, a, op1.RegNum, op2.RegNum);
		if (!forcompare)
		{
			build->Emit(OP_JMP, 1);
			build->Emit(OP_LI, to.RegNum, 1);
		}
		op1.Free(build);
		op2.Free(build);
		return to;
	}
	else
	{

		// Only the second operand may be constant.
		if (op1.Konst)
		{
			swapvalues(op1, op2);
		}
		assert(!op1.Konst);
		assert(op1.RegCount >= 1 && op1.RegCount <= 3);

		ExpEmit to(build, REGT_INT);

		static int flops[] = { OP_EQF_R, OP_EQV2_R, OP_EQV3_R };
		instr = op1.RegType == REGT_INT ? OP_EQ_R :
			op1.RegType == REGT_FLOAT ? flops[op1.RegCount - 1] :
			OP_EQA_R;
		op1.Free(build);
		if (!op2.Konst)
		{
			op2.Free(build);
		}
		else
		{
			instr += 1;
		}

		// See FxUnaryNotBoolean for comments, since it's the same thing.
		if (!forcompare) build->Emit(OP_LI, to.RegNum, 0, 0);
		build->Emit(instr, int(invert) ^ (Operator == TK_ApproxEq ? CMP_APPROX : ((Operator != TK_Eq) ? CMP_CHECK : 0)), op1.RegNum, op2.RegNum);
		if (!forcompare)
		{
			build->Emit(OP_JMP, 1);
			build->Emit(OP_LI, to.RegNum, 1);
		}
		return to;
	}
}